

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesBodySharedMass::Compute_invMb_v
          (ChVariablesBodySharedMass *this,ChVectorRef *result,ChVectorConstRef vect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ChSharedMassBody *pCVar10;
  double *pdVar11;
  double *pdVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  lVar7 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  iVar13 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])();
  if (lVar7 != iVar13) {
    __assert_fail("vect.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodySharedMass.cpp"
                  ,0x4b,
                  "virtual void chrono::ChVariablesBodySharedMass::Compute_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar7 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  iVar13 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])(this);
  if (lVar7 != iVar13) {
    __assert_fail("result.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodySharedMass.cpp"
                  ,0x4c,
                  "virtual void chrono::ChVariablesBodySharedMass::Compute_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  uVar8 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if (0 < (long)uVar8) {
    uVar9 = *(ulong *)&(result->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       ).field_0x8;
    if (0 < (long)uVar9) {
      pCVar10 = this->sharedmass;
      pdVar11 = (vect->
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_data;
      pdVar12 = *(double **)
                 &result->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      *pdVar12 = pCVar10->inv_mass * *pdVar11;
      if (uVar8 == 1) goto LAB_007df9ee;
      if (uVar9 != 1) {
        pdVar12[1] = pCVar10->inv_mass * pdVar11[1];
        if (uVar8 < 3) goto LAB_007df9ee;
        if (2 < uVar9) {
          pdVar12[2] = pCVar10->inv_mass * pdVar11[2];
          if (((uVar8 == 3) || (uVar8 < 5)) || (uVar8 == 5)) goto LAB_007df9ee;
          if (uVar9 != 3) {
            auVar14._8_8_ = 0;
            auVar14._0_8_ =
                 (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar20._8_8_ = 0;
            auVar20._0_8_ =
                 (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar1._8_8_ = 0;
            auVar1._0_8_ = pdVar11[3];
            auVar17._8_8_ = 0;
            auVar17._0_8_ =
                 (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] * pdVar11[4];
            auVar1 = vfmadd231sd_fma(auVar17,auVar14,auVar1);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = pdVar11[5];
            auVar1 = vfmadd231sd_fma(auVar1,auVar20,auVar2);
            pdVar12[3] = auVar1._0_8_;
            if (4 < uVar9) {
              auVar18._8_8_ = 0;
              auVar18._0_8_ =
                   (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
              auVar15._8_8_ = 0;
              auVar15._0_8_ =
                   (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = pdVar11[3];
              auVar21._8_8_ = 0;
              auVar21._0_8_ =
                   (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] * pdVar11[4];
              auVar1 = vfmadd231sd_fma(auVar21,auVar18,auVar3);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar11[5];
              auVar1 = vfmadd231sd_fma(auVar1,auVar15,auVar4);
              pdVar12[4] = auVar1._0_8_;
              if (uVar9 != 5) {
                auVar19._8_8_ = 0;
                auVar19._0_8_ =
                     (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
                auVar16._8_8_ = 0;
                auVar16._0_8_ =
                     (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
                auVar5._8_8_ = 0;
                auVar5._0_8_ = pdVar11[3];
                auVar22._8_8_ = 0;
                auVar22._0_8_ =
                     (pCVar10->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7] * pdVar11[4];
                auVar1 = vfmadd231sd_fma(auVar22,auVar19,auVar5);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = pdVar11[5];
                auVar1 = vfmadd231sd_fma(auVar1,auVar16,auVar6);
                pdVar12[5] = auVar1._0_8_;
                return;
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_007df9ee:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChVariablesBodySharedMass::Compute_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(vect.size() == Get_ndof());
    assert(result.size() == Get_ndof());

    // optimized unrolled operations
    result(0) = sharedmass->inv_mass * vect(0);
    result(1) = sharedmass->inv_mass * vect(1);
    result(2) = sharedmass->inv_mass * vect(2);
    result(3) = sharedmass->inv_inertia(0, 0) * vect(3) + sharedmass->inv_inertia(0, 1) * vect(4) +
                sharedmass->inv_inertia(0, 2) * vect(5);
    result(4) = sharedmass->inv_inertia(1, 0) * vect(3) + sharedmass->inv_inertia(1, 1) * vect(4) +
                sharedmass->inv_inertia(1, 2) * vect(5);
    result(5) = sharedmass->inv_inertia(2, 0) * vect(3) + sharedmass->inv_inertia(2, 1) * vect(4) +
                sharedmass->inv_inertia(2, 2) * vect(5);
}